

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  InternalMetadata *this_00;
  ulong uVar1;
  uint uVar2;
  LogMessage *other;
  GeneratedCodeInfo *this_01;
  undefined8 *puVar3;
  GeneratedCodeInfo *from_00;
  LogFinisher local_61;
  LogMessage local_60;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_File_004d10c0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  (this->name_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(ulong)(from->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->insertion_point_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->insertion_point_,
               (ulong)(from->insertion_point_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->content_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 4) != 0) {
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->content_,(ulong)(from->content_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3)
    ;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  from_00 = from->generated_code_info_;
  if ((from_00 == (GeneratedCodeInfo *)0x0 & (byte)uVar2 >> 3) == 1) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.h"
               ,0x677);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: !value || generated_code_info_ != nullptr: ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
    from_00 = from->generated_code_info_;
  }
  else if ((uVar2 & 8) == 0) {
    this_01 = (GeneratedCodeInfo *)0x0;
    goto LAB_00282ca0;
  }
  this_01 = (GeneratedCodeInfo *)operator_new(0x30);
  GeneratedCodeInfo::GeneratedCodeInfo(this_01,from_00);
LAB_00282ca0:
  this->generated_code_info_ = this_01;
  return;
}

Assistant:

CodeGeneratorResponse_File::CodeGeneratorResponse_File(const CodeGeneratorResponse_File& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArenaForAllocation());
  }
  insertion_point_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    insertion_point_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_insertion_point()) {
    insertion_point_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_insertion_point(), 
      GetArenaForAllocation());
  }
  content_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    content_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_content()) {
    content_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_content(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_generated_code_info()) {
    generated_code_info_ = new ::PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo(*from.generated_code_info_);
  } else {
    generated_code_info_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.CodeGeneratorResponse.File)
}